

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O2

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenFltNum(Lexer *this,size_t num)

{
  int iVar1;
  ulong in_RDX;
  _func_int **pp_Var2;
  undefined1 auVar3 [16];
  undefined2 local_a2;
  undefined1 local_a0 [12];
  float local_94;
  float local_90;
  undefined1 local_8c [20];
  Position local_78;
  Position local_60;
  double local_48;
  double dStack_40;
  
  nextChar((Lexer *)num);
  local_90 = (float)in_RDX;
  auVar3._8_4_ = (int)(in_RDX >> 0x20);
  auVar3._0_8_ = in_RDX;
  auVar3._12_4_ = 0x45300000;
  dStack_40 = auVar3._8_8_ - 1.9342813113834067e+25;
  local_48 = dStack_40 + ((double)CONCAT44(0x43300000,(int)in_RDX) - 4503599627370496.0);
  local_a0._8_4_ = local_90;
  local_8c._4_8_ = local_48;
  if (9 < *(int *)(num + 0xb0) - 0x30U) {
    local_a2 = LEX_ERR_ID_NOT_JUST_ANYS;
    local_8c._0_4_ = 9;
    getCurrentCursor(&local_78,(Lexer *)num);
    local_60.startIndex = *(size_t *)(num + 0xa8);
    local_60.line = local_78.line;
    local_60.endIndex = local_60.startIndex;
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)local_a0,(LexerErrorCode *)&local_a2,(Position *)local_8c);
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)local_a0);
    return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
           (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
  }
  local_8c._12_8_ = 10.0;
  local_94 = 10.0;
  do {
    iVar1 = *(int *)(num + 0xb0) + -0x30;
    local_90 = local_90 + (float)iVar1 / local_94;
    local_48 = local_48 + (double)iVar1 / (double)local_8c._12_8_;
    local_94 = local_94 * 10.0;
    local_8c._12_8_ = (double)local_8c._12_8_ * 10.0;
    iVar1 = nextChar((Lexer *)num);
  } while (iVar1 - 0x30U < 10);
  local_a0._8_4_ = local_90;
  local_8c._4_8_ = local_48;
  if (*(int *)(num + 0xb0) == 0x46) {
    nextChar((Lexer *)num);
  }
  else if (*(int *)(num + 0xb0) == 0x66) {
    nextChar((Lexer *)num);
    local_a0._0_2_ = LVL_HELP|LVL_NOTE|LVL_ERROR;
    getCurrentCursor(&local_60,(Lexer *)num);
    std::
    make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,float&>
              ((Token **)&local_78,(TokenType *)(num + 0xb8),(Position *)local_a0,(float *)&local_60
              );
    pp_Var2 = (_func_int **)local_78.line;
    goto LAB_00107492;
  }
  pp_Var2 = (_func_int **)0x0;
LAB_00107492:
  iVar1 = isalnum(*(int *)(num + 0xb0));
  if (iVar1 == 0) {
    if (pp_Var2 == (_func_int **)0x0) {
      local_a0._0_2_ = LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING;
      getCurrentCursor(&local_60,(Lexer *)num);
      std::
      make_unique<pfederc::NumberToken,pfederc::Token*&,pfederc::TokenType,pfederc::Position,double&>
                ((Token **)&local_78,(TokenType *)(num + 0xb8),(Position *)local_a0,
                 (double *)&local_60);
      this->_vptr_Lexer = (_func_int **)local_78.line;
    }
    else {
      this->_vptr_Lexer = pp_Var2;
    }
  }
  else {
    local_a2 = LEX_ERR_ID_NOT_JUST_ANYS;
    local_8c._0_4_ = 9;
    getCurrentCursor(&local_78,(Lexer *)num);
    local_60.startIndex = *(size_t *)(num + 0xa8);
    local_60.line = local_78.line;
    local_60.endIndex = local_60.startIndex;
    std::
    make_unique<pfederc::Error<pfederc::LexerErrorCode>,pfederc::Level,pfederc::LexerErrorCode,pfederc::Position>
              ((Level *)local_a0,(LexerErrorCode *)&local_a2,(Position *)local_8c);
    generateError(this,(unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                        *)num);
    std::
    unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
    ::~unique_ptr((unique_ptr<pfederc::Error<pfederc::LexerErrorCode>,_std::default_delete<pfederc::Error<pfederc::LexerErrorCode>_>_>
                   *)local_a0);
    if (pp_Var2 != (_func_int **)0x0) {
      (**(code **)(*pp_Var2 + 8))(pp_Var2);
    }
  }
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenFltNum(size_t num) noexcept {
  nextChar(); // eat .

  float f32 = static_cast<float>(num);
  double f64 = static_cast<double>(num);
  
  if (!isdigit(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  float po32 = 10.0f;
  double po64 = 10.0;

  do {
    f32 += static_cast<float>(currentChar - '0') / po32;
    f64 += static_cast<double>(currentChar - '0') / po64;
    po32 *= 10.0f;
    po64 *= 10.0;
  } while (isdigit(nextChar()));

  std::unique_ptr<Token> tok(nullptr);
  switch (currentChar) {
  case 'f':
    nextChar(); // eat f
    tok = std::make_unique<NumberToken>(currentToken, TokenType::TOK_FLT32, getCurrentCursor(), f32);
    break;
  case 'F':
    nextChar(); // eat F
    break;
  default:
    break;
  }

  if (isalnum(currentChar))
    return generateError(std::make_unique<LexerError>(LVL_ERROR,
      LexerErrorCode::LEX_ERR_NUM_UNEXPECTED_CHAR, Position{getCurrentCursor().line,
        currentEndIndex, currentEndIndex}));

  if (tok)
    return tok;

  return std::make_unique<NumberToken>(currentToken, TokenType::TOK_FLT64, getCurrentCursor(), f64);
}